

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O3

GLenum __thiscall irr::video::COpenGLDriver::getGLBlend(COpenGLDriver *this,E_BLEND_FACTOR factor)

{
  GLenum GVar1;
  
  GVar1 = 0;
  if (factor - EBF_ONE < 10) {
    GVar1 = *(GLenum *)(&DAT_0023064c + (ulong)(factor - EBF_ONE) * 4);
  }
  return GVar1;
}

Assistant:

GLenum COpenGLDriver::getGLBlend(E_BLEND_FACTOR factor) const
{
	GLenum r = 0;
	switch (factor) {
	case EBF_ZERO:
		r = GL_ZERO;
		break;
	case EBF_ONE:
		r = GL_ONE;
		break;
	case EBF_DST_COLOR:
		r = GL_DST_COLOR;
		break;
	case EBF_ONE_MINUS_DST_COLOR:
		r = GL_ONE_MINUS_DST_COLOR;
		break;
	case EBF_SRC_COLOR:
		r = GL_SRC_COLOR;
		break;
	case EBF_ONE_MINUS_SRC_COLOR:
		r = GL_ONE_MINUS_SRC_COLOR;
		break;
	case EBF_SRC_ALPHA:
		r = GL_SRC_ALPHA;
		break;
	case EBF_ONE_MINUS_SRC_ALPHA:
		r = GL_ONE_MINUS_SRC_ALPHA;
		break;
	case EBF_DST_ALPHA:
		r = GL_DST_ALPHA;
		break;
	case EBF_ONE_MINUS_DST_ALPHA:
		r = GL_ONE_MINUS_DST_ALPHA;
		break;
	case EBF_SRC_ALPHA_SATURATE:
		r = GL_SRC_ALPHA_SATURATE;
		break;
	}
	return r;
}